

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O3

char * stumpless_get_entry_app_name(stumpless_entry *entry)

{
  char *__dest;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
    __dest = (char *)0x0;
  }
  else {
    pthread_lock_mutex((pthread_mutex_t *)entry->mutex);
    __dest = (char *)alloc_mem(entry->app_name_length + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,entry->app_name,entry->app_name_length + 1);
      clear_error();
    }
    pthread_unlock_mutex((pthread_mutex_t *)entry->mutex);
  }
  return __dest;
}

Assistant:

const char *
stumpless_get_entry_app_name( const struct stumpless_entry *entry ) {
  char *app_name_copy;

  VALIDATE_ARG_NOT_NULL( entry );

  lock_entry( entry );
  app_name_copy = alloc_mem( entry->app_name_length + 1 );
  if( !app_name_copy ) {
    goto cleanup_and_return;
  }
  memcpy( app_name_copy, entry->app_name, entry->app_name_length + 1 );
  clear_error(  );

cleanup_and_return:
  unlock_entry( entry );
  return app_name_copy;
}